

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_arena.c
# Opt level: O1

_Bool vma_has_flag(unsigned_long vm_start,char *flag)

{
  long lVar1;
  int iVar2;
  FILE *__stream;
  byte *pbVar3;
  void *ptr;
  uint in_ECX;
  byte *pbVar4;
  byte bVar5;
  uint uVar6;
  ulong extraout_RDX;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  uint in_R8D;
  char cVar11;
  byte *__s;
  _Bool _Var12;
  byte local_448;
  undefined7 uStack_447;
  char buf [1024];
  undefined8 local_40;
  unsigned_long end;
  unsigned_long start;
  
  end = 0;
  local_40 = 0;
  pcVar8 = "/proc/self/smaps";
  pcVar7 = "r";
  __stream = fopen("/proc/self/smaps","r");
  if (__stream == (FILE *)0x0) {
    vma_has_flag_cold_1();
    uVar9 = 0x10000;
    if (0x10000 < in_ECX) {
      uVar9 = (ulong)in_ECX;
    }
    lVar1 = 0x3f;
    if (uVar9 - 1 != 0) {
      for (; uVar9 - 1 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar10 = 1L << (-((byte)lVar1 ^ 0x3f) & 0x3f);
    pcVar8[0] = '\0';
    pcVar8[1] = '\0';
    pcVar8[2] = '\0';
    pcVar8[3] = '\0';
    pcVar8[4] = '\0';
    pcVar8[5] = '\0';
    pcVar8[6] = '\0';
    pcVar8[7] = '\0';
    *(int *)(pcVar8 + 0x28) = (int)uVar10;
    *(char **)(pcVar8 + 0x20) = pcVar7;
    uVar9 = (ulong)*(uint *)(pcVar7 + 4) << 10;
    if (extraout_RDX <= uVar9) {
      uVar9 = extraout_RDX;
    }
    uVar10 = uVar10 & 0xffffffff;
    uVar9 = -uVar10 & (uVar9 + uVar10) - 1;
    *(ulong *)(pcVar8 + 0x10) = uVar9;
    pcVar8[0x18] = '\0';
    pcVar8[0x19] = '\0';
    pcVar8[0x1a] = '\0';
    pcVar8[0x1b] = '\0';
    pcVar8[0x1c] = '\0';
    pcVar8[0x1d] = '\0';
    pcVar8[0x1e] = '\0';
    pcVar8[0x1f] = '\0';
    if ((int)in_R8D < 0) {
      if ((~in_R8D & 0x80000002) != 0 && (~in_R8D & 0x80000001) != 0) {
        __assert_fail("IS_SLAB_ARENA_FLAG(flags, SLAB_ARENA_PRIVATE) || IS_SLAB_ARENA_FLAG(flags, SLAB_ARENA_SHARED)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_arena.c"
                      ,0xad,"void slab_arena_flags_init(struct slab_arena *, int)");
      }
      *(uint *)(pcVar8 + 0x2c) = in_R8D;
    }
    else {
      if ((in_R8D & 3) == 0) {
        __assert_fail("flags & (MAP_PRIVATE | MAP_SHARED)",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_arena.c"
                      ,0xa4,"void slab_arena_flags_init(struct slab_arena *, int)");
      }
      if (in_R8D == 2) {
        pcVar8[0x2c] = '\x01';
        pcVar8[0x2d] = '\0';
        pcVar8[0x2e] = '\0';
        pcVar8[0x2f] = -0x80;
      }
      else {
        pcVar8[0x2c] = '\x02';
        pcVar8[0x2d] = '\0';
        pcVar8[0x2e] = '\0';
        pcVar8[0x2f] = -0x80;
      }
    }
    cVar11 = '\0';
    if (uVar9 == 0) {
      ptr = (void *)0x0;
    }
    else {
      ptr = mmap_checked(uVar9,uVar10,*(int *)(pcVar8 + 0x2c));
    }
    *(void **)(pcVar8 + 8) = ptr;
    madvise_checked(ptr,*(size_t *)(pcVar8 + 0x10),*(int *)(pcVar8 + 0x2c));
    if (*(long *)(pcVar8 + 0x10) != 0) {
      cVar11 = -(*(long *)(pcVar8 + 8) == 0);
    }
    return (_Bool)cVar11;
  }
  __s = &local_448;
  pcVar7 = fgets((char *)__s,0x400,__stream);
  while (pcVar7 != (char *)0x0) {
    if (local_448 != 0) {
      pbVar3 = (byte *)&uStack_447;
      pbVar4 = (byte *)&uStack_447;
      bVar5 = local_448;
      do {
        pbVar3 = pbVar3 + 1;
        if (9 < (byte)(bVar5 - 0x30)) {
          uVar6 = bVar5 - 0x2d;
          if (0x39 < uVar6) break;
          if ((0x3f0000003f00000U >> ((ulong)uVar6 & 0x3f) & 1) == 0) {
            if ((ulong)uVar6 == 0) {
              bVar5 = *pbVar4;
              goto LAB_00101cb5;
            }
            break;
          }
        }
        bVar5 = *pbVar4;
        pbVar4 = pbVar4 + 1;
      } while (bVar5 != 0);
    }
LAB_00101c77:
    if ((buf[0] == ' ' && CONCAT71(uStack_447,local_448) == 0x3a7367616c466d56) && (end == vm_start)
       ) goto LAB_00101d06;
LAB_00101c97:
    pcVar7 = fgets((char *)__s,0x400,__stream);
  }
  __s = (byte *)0x0;
LAB_00101d06:
  if ((__s == (byte *)0x0) || (pcVar7 = strtok((char *)__s," \n"), pcVar7 == (char *)0x0)) {
    _Var12 = false;
  }
  else {
    do {
      iVar2 = strcmp(pcVar7,"dd");
      _Var12 = iVar2 == 0;
      if (_Var12) break;
      pcVar7 = strtok((char *)0x0," \n");
    } while (pcVar7 != (char *)0x0);
  }
  fclose(__stream);
  return _Var12;
LAB_00101cb5:
  if (bVar5 == 0) goto LAB_00101c77;
  if ((9 < (byte)(bVar5 - 0x30)) &&
     ((0x25 < bVar5 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar5 - 0x41) & 0x3f) & 1) == 0)))) {
    if (bVar5 == 0x20) {
      __isoc99_sscanf(__s,"%lx-%lx",&end,&local_40);
      goto LAB_00101c97;
    }
    goto LAB_00101c77;
  }
  bVar5 = *pbVar3;
  pbVar3 = pbVar3 + 1;
  goto LAB_00101cb5;
}

Assistant:

static bool
vma_has_flag(unsigned long vm_start, const char *flag)
{
	unsigned long start = 0, end = 0;
	char buf[1024], *tok = NULL;
	bool found = false;
	FILE *f = NULL;

	f = fopen("/proc/self/smaps", "r");
	fail_unless(f != NULL);

	while (fgets(buf, sizeof(buf), f)) {
		if (is_vma_range_fmt(buf, &start, &end))
			continue;
		if (strncmp(buf, "VmFlags: ", 9) || start != vm_start)
			continue;
		tok = buf;
		break;
	}

	if (tok) {
		for (tok = strtok(tok, " \n"); tok;
		     tok = strtok(NULL, " \n")) {
			if (strcmp(tok, flag))
				continue;
			found = true;
			break;
		}
	}

	fclose(f);
	return found;
}